

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmTarget * __thiscall
cmMakefile::AddExecutable
          (cmMakefile *this,char *exeName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs,bool excludeFromAll)

{
  cmTarget *this_00;
  allocator local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,exeName,&local_49);
  this_00 = AddNewTarget(this,EXECUTABLE,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (excludeFromAll) {
    std::__cxx11::string::string((string *)&local_48,"EXCLUDE_FROM_ALL",&local_49);
    cmTarget::SetProperty(this_00,&local_48,"TRUE");
    std::__cxx11::string::~string((string *)&local_48);
  }
  cmTarget::AddSources(this_00,srcs);
  std::__cxx11::string::string((string *)&local_48,exeName,&local_49);
  AddGlobalLinkInformation(this,&local_48,this_00);
  std::__cxx11::string::~string((string *)&local_48);
  return this_00;
}

Assistant:

cmTarget* cmMakefile::AddExecutable(const char *exeName,
                                    const std::vector<std::string> &srcs,
                                    bool excludeFromAll)
{
  cmTarget* target = this->AddNewTarget(cmState::EXECUTABLE, exeName);
  if(excludeFromAll)
    {
    target->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
    }
  target->AddSources(srcs);
  this->AddGlobalLinkInformation(exeName, *target);
  return target;
}